

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O3

int randomx_blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  int iVar1;
  uchar *p;
  long lVar2;
  
  iVar1 = -1;
  if (S != (blake2b_state *)0x0 && P != (blake2b_param *)0x0) {
    lVar2 = 0;
    memset(S->t,0,0xb0);
    S->h[0] = 0x6a09e667f3bcc908;
    S->h[1] = 0xbb67ae8584caa73b;
    S->h[2] = 0x3c6ef372fe94f82b;
    S->h[3] = 0xa54ff53a5f1d36f1;
    S->h[4] = 0x510e527fade682d1;
    S->h[5] = 0x9b05688c2b3e6c1f;
    S->h[6] = 0x1f83d9abfb41bd6b;
    S->h[7] = 0x5be0cd19137e2179;
    do {
      S->h[lVar2] = S->h[lVar2] ^ *(ulong *)(P->reserved + lVar2 * 8 + -0x12);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    S->outlen = (uint)P->digest_length;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int blake2b_init_param(blake2b_state *S, const blake2b_param *P) {
	const unsigned char *p = (const unsigned char *)P;
	unsigned int i;

	if (NULL == P || NULL == S) {
		return -1;
	}

	blake2b_init0(S);
	/* IV XOR Parameter Block */
	for (i = 0; i < 8; ++i) {
		S->h[i] ^= load64(&p[i * sizeof(S->h[i])]);
	}
	S->outlen = P->digest_length;
	return 0;
}